

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
poly::
vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
::reserve(vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
          *this,size_type n,size_type avg_size,size_type max_align)

{
  elem_ptr_pointer pvVar1;
  void_pointer pvVar2;
  elem_ptr_pointer pvVar3;
  undefined1 auVar4 [16];
  length_error *this_00;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  elem_ptr_pointer pvVar10;
  void *local_38;
  long local_30;
  
  pvVar1 = (elem_ptr_pointer)(this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
  pvVar2 = this->_begin_storage;
  if ((((ulong)((long)pvVar2 - (long)pvVar1) / 0x28 < n) ||
      ((ulong)((long)(this->super_allocator_base<std::allocator<unsigned_char>_>)._end_storage -
              (long)pvVar2) < avg_size)) || (this->_align_max < max_align)) {
    pvVar3 = this->_free_elem;
    uVar6 = 0x48;
    if (pvVar1 != pvVar3) {
      uVar9 = ((long)pvVar3 - (long)pvVar1 >> 3) * -0x3333333333333333;
      uVar7 = (long)pvVar3[-1].ptr.first + ~(ulong)pvVar2 + uVar9 + pvVar3[-1].sf.first;
      if (uVar9 < uVar7 || uVar9 - uVar7 == 0) {
        uVar6 = uVar7 / uVar9 + 0x28;
      }
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar6;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar4,0) < n) {
      this_00 = (length_error *)__cxa_allocate_exception(0x10);
      std::length_error::length_error(this_00,"poly::vector reserve size too big");
      __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
    }
    if (max_align < this->_align_max) {
      max_align = this->_align_max;
    }
    uVar9 = (avg_size + max_align) - 1;
    uVar8 = 0;
    uVar9 = uVar9 - uVar9 % max_align;
    uVar6 = uVar9;
    uVar7 = max_align;
    if (pvVar1 != pvVar3) {
      pvVar10 = pvVar1;
      do {
        uVar6 = (pvVar10->sf).first + (max_align - 1);
        uVar7 = (uVar7 - uVar6 % max_align) + uVar6;
        pvVar10 = pvVar10 + 1;
      } while (pvVar10 != pvVar3);
      uVar8 = ((long)pvVar3 - (long)pvVar1 >> 3) * -0x3333333333333333;
      uVar6 = (uVar9 + uVar8 + uVar7) / (uVar8 + 1);
    }
    lVar5 = 0;
    if (uVar8 <= n) {
      lVar5 = n - uVar8;
    }
    uVar6 = uVar9 + n * 0x28 + uVar7 + lVar5 * uVar6;
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    local_38 = operator_new(uVar6);
    local_30 = (long)local_38 + uVar6;
    obtain_storage(this,&local_38,n,max_align);
    operator_delete(local_38,local_30 - (long)local_38);
  }
  return;
}

Assistant:

inline void vector<I, A, C>::reserve(size_type n, size_type avg_size, size_type max_align)
{
    using copy = std::conditional_t<interface_type_noexcept_movable::value, std::false_type,
        std::true_type>;
    if (n <= capacities().first && avg_size <= capacities().second && _align_max >= max_align) {
        return;
    }
    if (n > max_size()) {
        throw std::length_error("poly::vector reserve size too big");
    }
    increase_storage(n, avg_size, max_align, copy {});
}